

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# display.c
# Opt level: O3

void display_word(char *word,char *attempted_letters)

{
  char cVar1;
  char *pcVar2;
  int __c;
  char *pcVar3;
  
  cVar1 = *word;
  if (cVar1 != '\0') {
    pcVar3 = word + 1;
    do {
      __c = (int)cVar1;
      pcVar2 = strchr(attempted_letters,__c);
      if (pcVar2 == (char *)0x0) {
        __c = 0x2d;
      }
      putchar(__c);
      cVar1 = *pcVar3;
      pcVar3 = pcVar3 + 1;
    } while (cVar1 != '\0');
  }
  putchar(10);
  return;
}

Assistant:

void display_word(const char* word, char attempted_letters[27]) {
  for (size_t n = 0; word[n]; n++) {
    if (strchr(attempted_letters, word[n]) != NULL) {
      printf("%c", word[n]);
    } else {
      printf("-");
    }
  }
  printf("\n");
}